

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  Curl_llist_node *n;
  void *pvVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  
  pCVar1 = h->table;
  if (pCVar1 == (Curl_llist *)0x0) {
    pCVar1 = (Curl_llist *)(*Curl_cmalloc)(h->slots << 5);
    h->table = pCVar1;
    if (pCVar1 == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      pCVar1 = h->table;
      sVar2 = h->slots;
      if (sVar2 <= uVar6) break;
      Curl_llist_init((Curl_llist *)((long)&pCVar1->_head + lVar5),hash_element_dtor);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    }
  }
  else {
    sVar2 = h->slots;
  }
  sVar2 = (*h->hash_func)(key,key_len,sVar2);
  n = Curl_llist_head(pCVar1 + sVar2);
  do {
    if (n == (Curl_llist_node *)0x0) {
LAB_0012d0da:
      pvVar3 = (*Curl_cmalloc)(key_len + 0x40);
      if (pvVar3 == (void *)0x0) {
        return (void *)0x0;
      }
      memcpy((void *)((long)pvVar3 + 0x38),key,key_len);
      *(size_t *)((long)pvVar3 + 0x30) = key_len;
      *(void **)((long)pvVar3 + 0x20) = p;
      *(Curl_hash_elem_dtor *)((long)pvVar3 + 0x28) = dtor;
      Curl_llist_append(pCVar1 + sVar2,pvVar3,(Curl_llist_node *)pvVar3);
      h->size = h->size + 1;
      return p;
    }
    pvVar3 = Curl_node_elem(n);
    sVar4 = (*h->comp_func)((void *)((long)pvVar3 + 0x38),*(size_t *)((long)pvVar3 + 0x30),key,
                            key_len);
    if (sVar4 != 0) {
      Curl_node_uremove(n,h);
      h->size = h->size - 1;
      goto LAB_0012d0da;
    }
    n = Curl_node_next(n);
  } while( true );
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element  *he;
  struct Curl_llist_node *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    size_t i;
    h->table = malloc(h->slots * sizeof(struct Curl_llist));
    if(!h->table)
      return NULL; /* OOM */
    for(i = 0; i < h->slots; ++i)
      Curl_llist_init(&h->table[i], hash_element_dtor);
  }

  l = FETCH_LIST(h, key, key_len);

  for(le = Curl_llist_head(l); le; le = Curl_node_next(le)) {
    he = (struct Curl_hash_element *) Curl_node_elem(le);
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_node_uremove(le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p, dtor);
  if(he) {
    Curl_llist_append(l, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}